

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_storage.cpp
# Opt level: O0

void __thiscall libtorrent::aux::mmap_storage::~mmap_storage(mmap_storage *this)

{
  file_pool_impl<libtorrent::aux::file_view_entry> *this_00;
  bool bVar1;
  storage_index_t st;
  pointer this_01;
  undefined1 local_20 [8];
  error_code ec;
  mmap_storage *this_local;
  
  ec.cat_ = (error_category *)this;
  boost::system::error_code::error_code((error_code *)local_20);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_part_file);
  if (bVar1) {
    this_01 = ::std::
              unique_ptr<libtorrent::aux::part_file,_std::default_delete<libtorrent::aux::part_file>_>
              ::operator->(&this->m_part_file);
    part_file::flush_metadata(this_01,(error_code *)local_20);
  }
  this_00 = this->m_pool;
  st = storage_index(this);
  file_pool_impl<libtorrent::aux::file_view_entry>::release(this_00,st);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
  ~typed_bitfield(&this->m_file_created);
  ::std::unique_ptr<libtorrent::aux::part_file,_std::default_delete<libtorrent::aux::part_file>_>::
  ~unique_ptr(&this->m_part_file);
  container_wrapper<bool,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<bool,_std::allocator<bool>_>_>
  ::~container_wrapper(&this->m_use_partfile);
  ::std::__cxx11::string::~string((string *)&this->m_part_file_name);
  ::std::__cxx11::string::~string((string *)&this->m_save_path);
  container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  ::~container_wrapper(&this->m_file_priority);
  stat_cache::~stat_cache(&this->m_stat_cache);
  ::std::unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>::
  ~unique_ptr(&this->m_mapped_files);
  ::std::shared_ptr<void>::~shared_ptr(&this->m_torrent);
  ::std::enable_shared_from_this<libtorrent::aux::mmap_storage>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<libtorrent::aux::mmap_storage>);
  return;
}

Assistant:

mmap_storage::~mmap_storage()
	{
		error_code ec;
		if (m_part_file) m_part_file->flush_metadata(ec);

		// this may be called from a different
		// thread than the disk thread
		m_pool.release(storage_index());
	}